

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::
     log<char_const(&)[85],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
               (char *file,char line [7],LogSeverity severity,char *macroArgs,char (*params) [85],
               DebugExpression<bool> *params_1,char (*params_2) [56],Exception_conflict *params_3)

{
  char (*pacVar1) [85];
  LogSeverity line_00;
  uint uVar2;
  Debug *this;
  undefined4 in_register_00000014;
  DebugExpression<bool> *params_00;
  char (*params_01) [56];
  Exception *params_02;
  ArrayPtr<kj::String> AVar3;
  ArrayPtr<kj::String> in_stack_fffffffffffffed8;
  String *local_f0;
  undefined1 local_98 [8];
  char argValues [4] [7];
  String local_68;
  String local_50;
  kj *local_30;
  DebugExpression<bool> *params_local_1;
  char (*params_local) [85];
  char *macroArgs_local;
  LogSeverity severity_local;
  char *file_local;
  
  macroArgs_local._4_4_ = line._0_4_;
  local_30 = (kj *)params_1;
  params_local_1 = (DebugExpression<bool> *)params;
  params_local = (char (*) [85])macroArgs;
  macroArgs_local._0_4_ = severity;
  _severity_local = (Debug *)file;
  str<char_const(&)[85]>
            ((String *)local_98,(kj *)params,(char (*) [85])CONCAT44(in_register_00000014,severity))
  ;
  str<kj::_::DebugExpression<bool>&>((String *)(argValues[2] + 2),local_30,params_00);
  str<char_const(&)[56]>(&local_68,(kj *)params_2,params_01);
  str<kj::Exception&>(&local_50,(kj *)params_3,params_02);
  this = _severity_local;
  uVar2 = macroArgs_local._4_4_;
  line_00 = (LogSeverity)macroArgs_local;
  pacVar1 = params_local;
  AVar3 = arrayPtr<kj::String>((String *)local_98,4);
  logInternal(this,(char *)(ulong)uVar2,line_00,(LogSeverity)pacVar1,(char *)AVar3.ptr,
              in_stack_fffffffffffffed8);
  local_f0 = (String *)&stack0xffffffffffffffc8;
  do {
    local_f0 = local_f0 + -1;
    String::~String(local_f0);
  } while (local_f0 != (String *)local_98);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}